

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int num_keys_cmp(void *p1,void *p2,void *opaque)

{
  JSContext *in_RDX;
  long in_RSI;
  long in_RDI;
  BOOL atom2_is_integer;
  BOOL atom1_is_integer;
  uint32_t v2;
  uint32_t v1;
  JSAtom atom2;
  JSAtom atom1;
  JSContext *ctx;
  undefined4 local_38;
  uint in_stack_ffffffffffffffcc;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 local_4;
  
  uVar2 = *(undefined4 *)(in_RDI + 4);
  uVar1 = *(undefined4 *)(in_RSI + 4);
  JS_AtomIsArrayIndex(in_RDX,(uint32_t *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffcc);
  JS_AtomIsArrayIndex(in_RDX,(uint32_t *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffcc);
  if (in_stack_ffffffffffffffcc < local_38) {
    local_4 = -1;
  }
  else if (in_stack_ffffffffffffffcc == local_38) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int num_keys_cmp(const void *p1, const void *p2, void *opaque)
{
    JSContext *ctx = opaque;
    JSAtom atom1 = ((const JSPropertyEnum *)p1)->atom;
    JSAtom atom2 = ((const JSPropertyEnum *)p2)->atom;
    uint32_t v1, v2;
    BOOL atom1_is_integer, atom2_is_integer;

    atom1_is_integer = JS_AtomIsArrayIndex(ctx, &v1, atom1);
    atom2_is_integer = JS_AtomIsArrayIndex(ctx, &v2, atom2);
    assert(atom1_is_integer && atom2_is_integer);
    if (v1 < v2)
        return -1;
    else if (v1 == v2)
        return 0;
    else
        return 1;
}